

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O3

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_local_var_statement_t *stmt)

{
  vector<long,_std::allocator<long>_> *this_00;
  iterator __position;
  typed_var_expression_t *ptVar1;
  typed_expression_t *ptVar2;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_compiler;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  lvalue_compiler;
  long local_40;
  undefined **local_38;
  vector<long,_std::allocator<long>_> *local_30;
  undefined **local_28;
  vector<long,_std::allocator<long>_> *local_20;
  
  local_20 = (this->_bytecode_back_inserter).container;
  local_28 = &PTR__typed_expression_visitor_t_00215780;
  ptVar1 = typed_local_var_statement_t::variable(stmt);
  (**(code **)(*(long *)&(ptVar1->super_typed_lvalue_expression_t).super_typed_expression_t + 0x30))
            (ptVar1,&local_28);
  local_30 = (this->_bytecode_back_inserter).container;
  local_38 = &PTR__typed_expression_visitor_t_002156e8;
  ptVar2 = typed_local_var_statement_t::initial_value(stmt);
  (**(code **)(*(long *)ptVar2 + 0x30))(ptVar2,&local_38);
  local_40 = 0x1c;
  this_00 = (this->_bytecode_back_inserter).container;
  __position._M_current =
       (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(this_00,__position,&local_40);
  }
  else {
    *__position._M_current = 0x1c;
    (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_local_var_statement_t const & stmt)
  {
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> lvalue_compiler(_bytecode_back_inserter);
    stmt.variable().visit(lvalue_compiler);
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_compiler(_bytecode_back_inserter);
    stmt.initial_value().visit(rvalue_compiler);
    _bytecode_back_inserter = VM_INIT_FRAME;
  }